

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

ze_image_type_t to_image_type(string *type)

{
  bool bVar1;
  ze_image_type_t zVar2;
  
  bVar1 = std::operator==(type,"1D");
  zVar2 = ZE_IMAGE_TYPE_1D;
  if (!bVar1) {
    bVar1 = std::operator==(type,"2D");
    if (bVar1) {
      zVar2 = ZE_IMAGE_TYPE_2D;
    }
    else {
      bVar1 = std::operator==(type,"3D");
      if (bVar1) {
        zVar2 = ZE_IMAGE_TYPE_3D;
      }
      else {
        bVar1 = std::operator==(type,"1DARRAY");
        if (bVar1) {
          zVar2 = ZE_IMAGE_TYPE_1DARRAY;
        }
        else {
          bVar1 = std::operator==(type,"2DARRAY");
          if (bVar1) {
            zVar2 = ZE_IMAGE_TYPE_2DARRAY;
          }
          else {
            std::operator<<((ostream *)&std::cout,"Unknown ze_image_type_t value: ");
            zVar2 = ~ZE_IMAGE_TYPE_1D;
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_type_t to_image_type(const std::string type) {
  if (type == "1D") {
    return ZE_IMAGE_TYPE_1D;
  } else if (type == "2D") {
    return ZE_IMAGE_TYPE_2D;
  } else if (type == "3D") {
    return ZE_IMAGE_TYPE_3D;
  } else if (type == "1DARRAY") {
    return ZE_IMAGE_TYPE_1DARRAY;
  } else if (type == "2DARRAY") {
    return ZE_IMAGE_TYPE_2DARRAY;
  } else {
    std::cout << "Unknown ze_image_type_t value: ";
    return (static_cast<ze_image_type_t>(-1));
  }
}